

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrototypeChainCache.cpp
# Opt level: O0

void __thiscall
Js::ThreadCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::Clear
          (ThreadCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*>
  *node;
  ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> **ppSVar4;
  ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> **registration;
  Iterator __iter;
  bool hasItem;
  ThreadCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *this_local;
  
  __iter.current._7_1_ = 0;
  DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*,_RealCount>
  ::Iterator::Iterator((Iterator *)&registration,&this->scriptRegistrations);
  while( true ) {
    if (__iter.list ==
        (DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*,_RealCount>
         *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                                  ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    ppSVar4 = registration;
    node = DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*>
           ::Next(&(__iter.list)->
                   super_DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*>
                 );
    bVar2 = DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*,_RealCount>
            ::IsHead((DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*,_RealCount>
                      *)ppSVar4,node);
    if (bVar2) break;
    __iter.list = (DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*,_RealCount>
                   *)DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*>
                     ::Next(&(__iter.list)->
                             super_DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*>
                           );
    ppSVar4 = DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*,_RealCount>
              ::Iterator::Data((Iterator *)&registration);
    ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::Clear
              (*ppSVar4,true);
    __iter.current._7_1_ = 1;
  }
  __iter.list = (DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*,_RealCount>
                 *)0x0;
  if ((__iter.current._7_1_ & 1) != 0) {
    DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*,_RealCount>
    ::Reset(&this->scriptRegistrations);
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Reset
              ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this);
  }
  return;
}

Assistant:

void
ThreadCacheRegistry<T>::Clear()
{
    bool hasItem = false;
    FOREACH_DLISTBASE_ENTRY(ScriptCacheRegistry<T>*, registration, &this->scriptRegistrations)
    {
        registration->Clear(true /* isThreadClear */);
        hasItem = true;
    }
    NEXT_DLISTBASE_ENTRY;

    if (!hasItem)
    {
        return;
    }

    this->scriptRegistrations.Reset();
    this->arena.Reset();
}